

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

ostream * absl::operator<<(ostream *os,uint128 v)

{
  uint128 lhs;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  _Ios_Fmtflags _Var4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  void *this;
  fmtflags in_R8D;
  uint128 v_00;
  uint128 local_98;
  void *local_88;
  uint64_t local_80;
  _Ios_Fmtflags local_6c;
  long lStack_68;
  fmtflags adjustfield;
  size_t count;
  streamsize width;
  uint64_t local_50;
  undefined1 local_48 [8];
  string rep;
  fmtflags flags;
  ostream *os_local;
  uint128 v_local;
  
  v_00.lo_ = v.hi_;
  this = (void *)v.lo_;
  rep.field_2._12_4_ = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  v_00.hi_._0_4_ = rep.field_2._12_4_;
  v_00.hi_._4_4_ = 0;
  width = (streamsize)this;
  local_50 = v_00.lo_;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_((string *)local_48,this,v_00,in_R8D);
  uVar5 = std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0);
  count = uVar5;
  uVar6 = std::__cxx11::string::size();
  sVar2 = count;
  if (uVar6 < uVar5) {
    lStack_68 = std::__cxx11::string::size();
    lStack_68 = sVar2 - lStack_68;
    local_6c = std::operator&(rep.field_2._12_4_,_S_adjustfield);
    lVar1 = lStack_68;
    if (local_6c == _S_left) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)local_48,(char)lVar1);
    }
    else {
      if (((local_6c == _S_internal) &&
          (_Var4 = std::operator&(rep.field_2._12_4_,_S_showbase),
          _Var4 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max))) &&
         (_Var4 = std::operator&(rep.field_2._12_4_,_S_basefield), _Var4 == _S_hex)) {
        local_88 = this;
        local_80 = v_00.lo_;
        uint128::uint128(&local_98,0);
        lhs.hi_ = local_80;
        lhs.lo_ = (uint64_t)local_88;
        bVar3 = operator!=(lhs,local_98);
        lVar1 = lStack_68;
        if (bVar3) {
          std::ios::fill();
          std::__cxx11::string::insert((ulong)local_48,2,(char)lVar1);
          goto LAB_001f7da7;
        }
      }
      lVar1 = lStack_68;
      std::ios::fill();
      std::__cxx11::string::insert((ulong)local_48,0,(char)lVar1);
    }
  }
LAB_001f7da7:
  poVar7 = std::operator<<(os,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return poVar7;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(count, os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(size_t{2}, count, os.fill());
    } else {
      rep.insert(size_t{0}, count, os.fill());
    }
  }

  return os << rep;
}